

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

Result * __thiscall
httplib::ClientImpl::Get(ClientImpl *this,string *path,Headers *headers,Progress *progress)

{
  string *in_RDX;
  Request *in_RDI;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_R8;
  Request req;
  Request *this_00;
  function<bool_(unsigned_long,_unsigned_long)> *__x;
  function<bool_(unsigned_long,_unsigned_long)> *in_stack_fffffffffffffd90;
  function<bool_(unsigned_long,_unsigned_long)> local_260;
  Request *in_stack_fffffffffffffdc0;
  ClientImpl *in_stack_fffffffffffffdc8;
  Request *in_stack_fffffffffffffdd0;
  
  __x = &local_260;
  this_00 = in_RDI;
  Request::Request(in_stack_fffffffffffffdd0);
  std::__cxx11::string::operator=((string *)__x,"GET");
  std::__cxx11::string::operator=((string *)&stack0xfffffffffffffdc0,in_RDX);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)this_00,in_R8);
  std::function<bool_(unsigned_long,_unsigned_long)>::operator=(in_stack_fffffffffffffd90,__x);
  send_(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  Request::~Request(this_00);
  return (Result *)in_RDI;
}

Assistant:

inline Result ClientImpl::Get(const std::string& path, const Headers& headers,
        Progress progress) {
        Request req;
        req.method = "GET";
        req.path = path;
        req.headers = headers;
        req.progress = std::move(progress);

        return send_(std::move(req));
    }